

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZStream.h
# Opt level: O2

void __thiscall
TPZStream::Read<std::__cxx11::string>
          (TPZStream *this,
          TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *vec,void *context)

{
  int64_t nc;
  
  (*this->_vptr_TPZStream[0x1f])(this,&nc,1);
  (*vec->_vptr_TPZVec[3])(vec,nc);
  if (nc != 0) {
    (*this->_vptr_TPZStream[0x26])(this,vec->fStore);
  }
  return;
}

Assistant:

void Read(TPZVec<T> &vec, void *context) {
        int64_t c, nc;
        this->Read(&nc, 1);
        vec.Resize(nc);
        if constexpr (std::is_same<std::string,T>::value ||
                      is_arithmetic_pz<T>::value){
            if (nc) this->Read(&vec[0], nc);
        }
        else{
          for (c = 0; c < nc; c++) {
            vec[c].Read(*this, context);
          }
        }
    }